

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

CBlockIndex * ParseHashOrHeight(UniValue *param,ChainstateManager *chainman)

{
  long lVar1;
  string_view name;
  bool bVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *message;
  int *args_1;
  undefined8 uVar5;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  CChain *active_chain;
  int current_tip;
  int height;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  uint256 hash;
  ChainstateManager *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb8;
  int nHeight;
  uint256 *in_stack_fffffffffffffec0;
  BlockManager *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar6;
  int code;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  CBlockIndex *local_c0;
  
  nHeight = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffee8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
             ,(char *)in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ChainstateManager::ActiveChain(in_stack_fffffffffffffea8);
  bVar2 = UniValue::isNum((UniValue *)in_stack_fffffffffffffea8);
  uVar6 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffef4);
  if (bVar2) {
    iVar3 = UniValue::getInt<int>
                      ((UniValue *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    code = (int)((ulong)this >> 0x20);
    if (iVar3 < 0) {
      message = (string *)__cxa_allocate_exception(0x58);
      tinyformat::format<int>(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      JSONRPCError(code,message);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(message,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0057a4a6;
    }
    iVar4 = CChain::Height((CChain *)in_stack_fffffffffffffea8);
    if (iVar4 < iVar3) {
      args_1 = (int *)__cxa_allocate_exception(0x58);
      tinyformat::format<int,int>
                ((char *)in_stack_fffffffffffffee8,(int *)CONCAT44(iVar4,in_stack_fffffffffffffee0),
                 args_1);
      JSONRPCError(code,in_stack_fffffffffffffee8);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(args_1,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0057a4a6;
    }
    local_c0 = CChain::operator[]((CChain *)in_stack_fffffffffffffec0,nHeight);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffec8,
               (char *)in_stack_fffffffffffffec0);
    name._M_str._0_4_ = in_stack_ffffffffffffff10;
    name._M_len = in_stack_ffffffffffffff08;
    name._M_str._4_4_ = in_stack_ffffffffffffff14;
    ParseHashV((UniValue *)CONCAT44(uVar6,in_stack_fffffffffffffef0),name);
    local_c0 = node::BlockManager::LookupBlockIndex
                         (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if (local_c0 == (CBlockIndex *)0x0) {
      uVar5 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)CONCAT44(uVar6,in_stack_fffffffffffffef0),
                 (allocator<char> *)in_stack_fffffffffffffee8);
      JSONRPCError((int)((ulong)this >> 0x20),in_stack_fffffffffffffee8);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_0057a4a6;
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c0;
  }
LAB_0057a4a6:
  __stack_chk_fail();
}

Assistant:

static const CBlockIndex* ParseHashOrHeight(const UniValue& param, ChainstateManager& chainman)
{
    LOCK(::cs_main);
    CChain& active_chain = chainman.ActiveChain();

    if (param.isNum()) {
        const int height{param.getInt<int>()};
        if (height < 0) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Target block height %d is negative", height));
        }
        const int current_tip{active_chain.Height()};
        if (height > current_tip) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Target block height %d after current tip %d", height, current_tip));
        }

        return active_chain[height];
    } else {
        const uint256 hash{ParseHashV(param, "hash_or_height")};
        const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(hash);

        if (!pindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }

        return pindex;
    }
}